

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

double __thiscall
bgui::ImageAdapter<unsigned_char>::getPixel(ImageAdapter<unsigned_char> *this,float x,float y,int c)

{
  pointer pIVar1;
  uint uVar2;
  work_t wVar3;
  int iVar4;
  int iVar5;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  uint uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  
  if ((this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar8 = (double)this->image->img[c][(long)y][(long)x];
  }
  else {
    dVar8 = log(1.0 / (this->super_ImageAdapterBase).scale);
    uVar2 = (int)(dVar8 / 0.6931471805599453) - 1;
    pIVar1 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) >> 3) *
            -0x49249249 - 1;
    if ((int)uVar2 < (int)uVar6) {
      uVar6 = uVar2;
    }
    iVar5 = uVar6 + 1;
    iVar7 = 1 << ((byte)iVar5 & 0x1f);
    if ((int)uVar6 < 0) {
      this_00 = this->image;
      fVar11 = x;
      fVar10 = y;
    }
    else {
      this_00 = pIVar1 + uVar6;
      fVar10 = (float)iVar7;
      fVar11 = x / fVar10;
      fVar10 = y / fVar10;
    }
    wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                      (this_00,fVar11,fVar10,c);
    dVar8 = (double)wVar3;
    if (((-2 < (int)uVar6) &&
        (pIVar1 = (this->mipmap).
                  super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        iVar4 = (int)((ulong)((long)(this->mipmap).
                                    super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) >> 3)
        , SBORROW4(iVar5,iVar4 * -0x49249249) != iVar5 + iVar4 * 0x49249249 < 0)) &&
       (dVar9 = (double)iVar7, dVar9 = (1.0 / (this->super_ImageAdapterBase).scale - dVar9) / dVar9,
       1e-06 < dVar9)) {
      fVar11 = (float)(2 << ((byte)iVar5 & 0x1f));
      wVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (pIVar1 + iVar5,x / fVar11,y / fVar11,c);
      dVar8 = (1.0 - dVar9) * dVar8 + (double)wVar3 * dVar9;
    }
  }
  return dVar8;
}

Assistant:

double getPixel(float x, float y, int c) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);
        double ret;

        if (j < 0)
        {
          ret=image->getBilinear(x, y, c);
        }
        else
        {
          ret=mipmap[j].getBilinear(x/ds, y/ds, c);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            ret=(1-f)*ret+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), c);
          }
        }

        return ret;
      }

      return image->get(static_cast<long>(x), static_cast<long>(y), c);
    }